

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O3

size_t rcg::setRegister(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,uint8_t *buffer,
                       size_t len,bool exception)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  ulong uVar4;
  invalid_argument *piVar5;
  long *plVar6;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  
  peVar1 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  GenICam_3_4::gcstring::gcstring((gcstring *)&local_80,name);
  iVar2 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,&local_80);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring((gcstring *)&local_80);
  if (plVar3 == (long *)0x0) {
    if (exception) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Feature not found: ","");
      plVar3 = (long *)std::__cxx11::string::append((char *)local_a0);
      local_80 = (long *)*plVar3;
      plVar6 = plVar3 + 2;
      if (local_80 == plVar6) {
        local_70 = *plVar6;
        lStack_68 = plVar3[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *plVar6;
      }
      local_78 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar5,(string *)&local_80);
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    iVar2 = (*(code *)**(undefined8 **)((long)plVar3 + *(long *)(*plVar3 + -0x28)))
                      ((long)plVar3 + *(long *)(*plVar3 + -0x28));
    if ((iVar2 == 4) || (iVar2 == 2)) {
      plVar3 = (long *)__dynamic_cast(plVar3,&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IRegister::typeinfo,0xfffffffffffffffe);
      if (plVar3 != (long *)0x0) {
        uVar4 = (**(code **)(*plVar3 + 0x48))(plVar3,0);
        if (uVar4 < len) {
          len = uVar4;
        }
        (**(code **)(*plVar3 + 0x38))(plVar3,buffer,len,1);
        return len;
      }
      if (exception) {
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a0,"Feature not of type register: ","");
        plVar3 = (long *)std::__cxx11::string::append((char *)local_a0);
        local_80 = (long *)*plVar3;
        plVar6 = plVar3 + 2;
        if (local_80 == plVar6) {
          local_70 = *plVar6;
          lStack_68 = plVar3[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *plVar6;
        }
        local_78 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::invalid_argument::invalid_argument(piVar5,(string *)&local_80);
        __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    else if (exception) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Feature not writable: ","");
      plVar3 = (long *)std::__cxx11::string::append((char *)local_a0);
      local_80 = (long *)*plVar3;
      plVar6 = plVar3 + 2;
      if (local_80 == plVar6) {
        local_70 = *plVar6;
        lStack_68 = plVar3[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *plVar6;
      }
      local_78 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar5,(string *)&local_80);
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return 0;
}

Assistant:

size_t setRegister(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
  const uint8_t *buffer, size_t len, bool exception)
{
  size_t ret=0;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsWritable(node))
      {
        GenApi::IRegister *val=dynamic_cast<GenApi::IRegister *>(node);

        if (val != 0)
        {
          len=std::min(len, static_cast<size_t>(val->GetLength()));
          val->Set(buffer, len);
          ret=len;
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not of type register: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not writable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}